

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_without_glx.c
# Opt level: O0

EGLint override_eglGetError(void)

{
  undefined8 uVar1;
  code *pcVar2;
  EGLenum error;
  _func_EGLint *real_eglGetError;
  void *egl;
  
  uVar1 = dlopen("libEGL.so.1",1);
  pcVar2 = (code *)dlsym(uVar1,"eglGetError");
  egl._4_4_ = extra_error;
  if (extra_error == 0x3000) {
    if (pcVar2 == (code *)0x0) {
      __assert_fail("real_eglGetError",
                    "/workspace/llm4binary/github/license_c_cmakelists/yaronct[P]libepoxy/test/egl_without_glx.c"
                    ,0x56,"EGLint override_eglGetError(void)");
    }
    egl._4_4_ = (*pcVar2)();
  }
  else {
    extra_error = 0x3000;
  }
  return egl._4_4_;
}

Assistant:

static EGLint
override_eglGetError(void)
{
    void *egl = dlopen("libEGL.so.1", RTLD_LAZY | RTLD_LOCAL);
    EGLint (*real_eglGetError)(void) = dlsym(egl, "eglGetError");

    if (extra_error != EGL_SUCCESS) {
        EGLenum error = extra_error;
        extra_error = EGL_SUCCESS;
        return error;
    }

    assert(real_eglGetError);
    return real_eglGetError();
}